

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

void xmlTextReaderFreeNodeList(xmlTextReaderPtr reader,xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  _xmlAttr *p_Var3;
  xmlParserCtxtPtr pxVar4;
  xmlAttrPtr cur_00;
  int iVar5;
  xmlElementType xVar6;
  xmlDeregisterNodeFunc *pp_Var7;
  xmlChar *pxVar8;
  long local_40;
  xmlDictPtr local_38;
  
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    local_38 = (xmlDictPtr)0x0;
  }
  else {
    local_38 = reader->ctxt->dict;
  }
  xVar6 = cur->type;
  if ((xVar6 == XML_DOCUMENT_NODE) || (xVar6 == XML_HTML_DOCUMENT_NODE)) {
    xmlFreeDoc((xmlDocPtr)cur);
    return;
  }
  if (xVar6 == XML_NAMESPACE_DECL) {
    xmlFreeNsList((xmlNsPtr)cur);
    return;
  }
  local_40 = 0;
  do {
    while ((((xVar6 = cur->type, xVar6 != XML_ENTITY_REF_NODE && (xVar6 != XML_DTD_NODE)) &&
            (p_Var1 = cur->children, p_Var1 != (_xmlNode *)0x0)) && (p_Var1->parent == cur))) {
      local_40 = local_40 + 1;
      cur = p_Var1;
    }
    p_Var1 = cur->parent;
    p_Var2 = cur->next;
    if (xVar6 != XML_DTD_NODE) {
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var7 = __xmlDeregisterNodeDefaultValue(), *pp_Var7 != (xmlDeregisterNodeFunc)0x0)) {
        pp_Var7 = __xmlDeregisterNodeDefaultValue();
        (**pp_Var7)(cur);
      }
      if ((cur->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
         ((0x180002U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
        cur_00 = cur->properties;
        while (cur_00 != (xmlAttrPtr)0x0) {
          p_Var3 = cur_00->next;
          xmlTextReaderFreeProp(reader,cur_00);
          cur_00 = p_Var3;
        }
      }
      pxVar8 = cur->content;
      if ((_xmlAttr **)pxVar8 == &cur->properties) {
LAB_0019f7e3:
        xVar6 = cur->type;
      }
      else {
        xVar6 = cur->type;
        if (((XML_XINCLUDE_END < xVar6) ||
            ((0x180022U >> (xVar6 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
           (pxVar8 != (xmlChar *)0x0)) {
          if (local_38 != (xmlDictPtr)0x0) {
            iVar5 = xmlDictOwns(local_38,pxVar8);
            if (iVar5 != 0) goto LAB_0019f7e3;
            pxVar8 = cur->content;
          }
          (*xmlFree)(pxVar8);
          goto LAB_0019f7e3;
        }
      }
      if (((xVar6 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
          ((0x180002U >> (xVar6 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
         (cur->nsDef != (xmlNsPtr)0x0)) {
        xmlFreeNsList(cur->nsDef);
        xVar6 = cur->type;
      }
      if (((xVar6 != XML_TEXT_NODE) && (xVar6 != XML_COMMENT_NODE)) &&
         (pxVar8 = cur->name, pxVar8 != (xmlChar *)0x0)) {
        if (local_38 == (xmlDictPtr)0x0) {
LAB_0019f82e:
          (*xmlFree)(pxVar8);
        }
        else {
          iVar5 = xmlDictOwns(local_38,pxVar8);
          if (iVar5 == 0) {
            pxVar8 = cur->name;
            goto LAB_0019f82e;
          }
        }
        xVar6 = cur->type;
      }
      if ((((xVar6 | XML_ATTRIBUTE_NODE) == XML_TEXT_NODE) &&
          (pxVar4 = reader->ctxt, pxVar4 != (xmlParserCtxtPtr)0x0)) &&
         (iVar5 = pxVar4->freeElemsNr, iVar5 < 100)) {
        cur->next = pxVar4->freeElems;
        pxVar4->freeElems = cur;
        pxVar4->freeElemsNr = iVar5 + 1;
      }
      else {
        (*xmlFree)(cur);
      }
    }
    cur = p_Var2;
    if (p_Var2 == (_xmlNode *)0x0) {
      if ((local_40 == 0) || (p_Var1 == (_xmlNode *)0x0)) {
        return;
      }
      local_40 = local_40 + -1;
      p_Var1->children = (_xmlNode *)0x0;
      cur = p_Var1;
    }
  } while( true );
}

Assistant:

static void
xmlTextReaderFreeNodeList(xmlTextReaderPtr reader, xmlNodePtr cur) {
    xmlNodePtr next;
    xmlNodePtr parent;
    xmlDictPtr dict;
    size_t depth = 0;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur == NULL) return;
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNsList((xmlNsPtr) cur);
	return;
    }
    if ((cur->type == XML_DOCUMENT_NODE) ||
	(cur->type == XML_HTML_DOCUMENT_NODE)) {
	xmlFreeDoc((xmlDocPtr) cur);
	return;
    }
    while (1) {
        while ((cur->type != XML_DTD_NODE) &&
               (cur->type != XML_ENTITY_REF_NODE) &&
               (cur->children != NULL) &&
               (cur->children->parent == cur)) {
            cur = cur->children;
            depth += 1;
        }

        next = cur->next;
        parent = cur->parent;

	/* unroll to speed up freeing the document */
	if (cur->type != XML_DTD_NODE) {

	    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
		xmlDeregisterNodeDefaultValue(cur);

	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->properties != NULL))
		xmlTextReaderFreePropList(reader, cur->properties);
	    if ((cur->content != (xmlChar *) &(cur->properties)) &&
	        (cur->type != XML_ELEMENT_NODE) &&
		(cur->type != XML_XINCLUDE_START) &&
		(cur->type != XML_XINCLUDE_END) &&
		(cur->type != XML_ENTITY_REF_NODE)) {
		DICT_FREE(cur->content);
	    }
	    if (((cur->type == XML_ELEMENT_NODE) ||
	         (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->nsDef != NULL))
		xmlFreeNsList(cur->nsDef);

	    /*
	     * we don't free element names here they are interned now
	     */
	    if ((cur->type != XML_TEXT_NODE) &&
		(cur->type != XML_COMMENT_NODE))
		DICT_FREE(cur->name);
	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_TEXT_NODE)) &&
	        (reader != NULL) && (reader->ctxt != NULL) &&
		(reader->ctxt->freeElemsNr < MAX_FREE_NODES)) {
	        cur->next = reader->ctxt->freeElems;
		reader->ctxt->freeElems = cur;
		reader->ctxt->freeElemsNr++;
	    } else {
		xmlFree(cur);
	    }
	}

        if (next != NULL) {
	    cur = next;
        } else {
            if ((depth == 0) || (parent == NULL))
                break;
            depth -= 1;
            cur = parent;
            cur->children = NULL;
        }
    }
}